

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

lws_vhost * lws_select_vhost(lws_context *context,int port,char *servername)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  lws_vhost *plVar7;
  lws_vhost *plVar8;
  
  plVar7 = context->vhost_list;
  sVar3 = strlen(servername);
  pcVar4 = strchr(servername,0x3a);
  uVar6 = (long)pcVar4 - (long)servername;
  if (pcVar4 == (char *)0x0) {
    uVar6 = sVar3;
  }
  if (plVar7 != (lws_vhost *)0x0) {
    iVar5 = (int)uVar6;
    plVar8 = plVar7;
    do {
      if ((plVar8->listen_port == port) &&
         (iVar1 = strncmp(plVar8->name,servername,uVar6 & 0xffffffff), iVar1 == 0)) {
        _lws_log(8,"SNI: Found: %s\n",servername);
        return plVar8;
      }
      plVar8 = plVar8->vhost_next;
    } while (plVar8 != (lws_vhost *)0x0);
    plVar8 = plVar7;
    do {
      pcVar4 = plVar8->name;
      sVar3 = strlen(pcVar4);
      if ((((port != 0) && (plVar8->listen_port == port)) &&
          (uVar2 = (uint)sVar3, (int)uVar2 <= iVar5 + -2)) &&
         ((servername[(int)(~uVar2 + iVar5)] == '.' &&
          (iVar1 = strncmp(pcVar4,servername + ((long)iVar5 - (long)(int)uVar2),sVar3 & 0xffffffff),
          iVar1 == 0)))) {
        _lws_log(8,"SNI: Found %s on wildcard: %s\n",servername,pcVar4);
        return plVar8;
      }
      plVar8 = plVar8->vhost_next;
    } while (plVar8 != (lws_vhost *)0x0);
    if (plVar7 != (lws_vhost *)0x0) {
      while ((port == 0 || (plVar7->listen_port != port))) {
        plVar7 = plVar7->vhost_next;
        if (plVar7 == (lws_vhost *)0x0) {
          return (lws_vhost *)0x0;
        }
      }
      _lws_log(8,"%s: vhost match to %s based on port %d\n","lws_select_vhost",plVar7->name,port);
      return plVar7;
    }
  }
  return (lws_vhost *)0x0;
}

Assistant:

struct lws_vhost *
lws_select_vhost(struct lws_context *context, int port, const char *servername)
{
	struct lws_vhost *vhost = context->vhost_list;
	const char *p;
	int n, colon;

	n = (int)strlen(servername);
	colon = n;
	p = strchr(servername, ':');
	if (p)
		colon = lws_ptr_diff(p, servername);

	/* Priotity 1: first try exact matches */

	while (vhost) {
		if (port == vhost->listen_port &&
		    !strncmp(vhost->name, servername, (unsigned int)colon)) {
			lwsl_info("SNI: Found: %s\n", servername);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/*
	 * Priority 2: if no exact matches, try matching *.vhost-name
	 * unintentional matches are possible but resolve to x.com for *.x.com
	 * which is reasonable.  If exact match exists we already chose it and
	 * never reach here.  SSL will still fail it if the cert doesn't allow
	 * *.x.com.
	 */
	vhost = context->vhost_list;
	while (vhost) {
		int m = (int)strlen(vhost->name);
		if (port && port == vhost->listen_port &&
		    m <= (colon - 2) &&
		    servername[colon - m - 1] == '.' &&
		    !strncmp(vhost->name, servername + colon - m, (unsigned int)m)) {
			lwsl_info("SNI: Found %s on wildcard: %s\n",
				    servername, vhost->name);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* Priority 3: match the first vhost on our port */

	vhost = context->vhost_list;
	while (vhost) {
		if (port && port == vhost->listen_port) {
			lwsl_info("%s: vhost match to %s based on port %d\n",
					__func__, vhost->name, port);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* no match */

	return NULL;
}